

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::SpotLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,SpotLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [56];
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  Vector3f wl;
  SampledSpectrum SVar29;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 local_28 [16];
  undefined1 auVar16 [56];
  undefined1 auVar23 [64];
  
  auVar18 = ZEXT816(0) << 0x40;
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar18,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar18,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar12 = vfmadd231ss_fma(auVar12,auVar18,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar10 = vfmadd231ss_fma(auVar10,auVar18,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  auVar18._0_4_ = auVar8._0_4_ * 0.0;
  auVar18._4_4_ = auVar8._4_4_ * 0.0;
  auVar18._8_4_ = auVar8._8_4_ * 0.0;
  auVar18._12_4_ = auVar8._12_4_ * 0.0;
  fVar9 = auVar10._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar4 = auVar12._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  bVar3 = fVar9 == 1.0;
  uVar6 = 0xff;
  if (!bVar3) {
    uVar6 = 0;
  }
  uVar7 = (ulong)uVar6;
  if (NAN(fVar9)) {
    uVar7 = 0;
  }
  local_38 = (float)((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar9));
  auVar8 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  fVar4 = local_38 +
          (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          -0.5;
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  auVar12 = vfmadd213ps_fma(auVar8,ZEXT816(0) << 0x40,auVar18);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar12 = vfmadd213ps_fma(auVar8,ZEXT816(0) << 0x40,auVar12);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][3]),0x10);
  auVar10._0_4_ = auVar8._0_4_ + auVar12._0_4_;
  auVar10._4_4_ = auVar8._4_4_ + auVar12._4_4_;
  auVar10._8_4_ = auVar8._8_4_ + auVar12._8_4_;
  auVar10._12_4_ = auVar8._12_4_ + auVar12._12_4_;
  auVar19._4_4_ = fVar9;
  auVar19._0_4_ = fVar9;
  auVar19._8_4_ = fVar9;
  auVar19._12_4_ = fVar9;
  auVar8 = vdivps_avx(auVar10,auVar19);
  auVar12 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                          ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  bVar3 = (bool)((byte)uVar7 & 1);
  local_48 = (float)((uint)bVar3 * (int)auVar10._0_4_ | (uint)!bVar3 * auVar8._0_4_);
  bVar3 = (bool)((byte)(uVar7 >> 1) & 1);
  fStack_44 = (float)((uint)bVar3 * (int)auVar10._4_4_ | (uint)!bVar3 * auVar8._4_4_);
  bVar3 = (bool)((byte)(uVar7 >> 2) & 1);
  fStack_40 = (float)((uint)bVar3 * (int)auVar10._8_4_ | (uint)!bVar3 * auVar8._8_4_);
  bVar3 = (bool)((byte)(uVar7 >> 3) & 1);
  fStack_3c = (float)((uint)bVar3 * (int)auVar10._12_4_ | (uint)!bVar3 * auVar8._12_4_);
  auVar11._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar12._0_4_;
  auVar11._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar12._4_4_;
  auVar11._8_4_ = auVar12._8_4_ + 0.0;
  auVar11._12_4_ = auVar12._12_4_ + 0.0;
  auVar8._8_4_ = 0xbf000000;
  auVar8._0_8_ = 0xbf000000bf000000;
  auVar8._12_4_ = 0xbf000000;
  auVar8 = vmulps_avx512vl(auVar11,auVar8);
  auVar12._0_4_ = local_48 + auVar8._0_4_;
  auVar12._4_4_ = fStack_44 + auVar8._4_4_;
  auVar12._8_4_ = fStack_40 + auVar8._8_4_;
  auVar12._12_4_ = fStack_3c + auVar8._12_4_;
  auVar20._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar20._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar20._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar20._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar8 = vhaddps_avx(auVar20,auVar20);
  fVar9 = auVar8._0_4_ + fVar4 * fVar4;
  local_28 = ZEXT416((uint)fVar9);
  auVar8 = vsqrtss_avx(local_28,ZEXT416((uint)fVar9));
  fVar17 = auVar8._0_4_;
  auVar26._4_4_ = fVar17;
  auVar26._0_4_ = fVar17;
  auVar26._8_4_ = fVar17;
  auVar26._12_4_ = fVar17;
  auVar11 = ZEXT416((uint)(fVar4 / fVar17));
  local_58 = vdivps_avx(auVar12,auVar26);
  auVar8 = vmovshdup_avx(local_58);
  fVar9 = auVar8._0_4_;
  auVar8 = vfnmsub231ss_fma(ZEXT416((uint)(fVar9 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                   [1])),local_58,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar10 = vfnmsub231ss_fma(ZEXT416((uint)(fVar9 * (this->super_LightBase).renderFromLight.mInv.m
                                                    [1][1])),local_58,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar18 = vfnmsub231ss_fma(ZEXT416((uint)(fVar9 * (this->super_LightBase).renderFromLight.mInv.m
                                                    [2][1])),local_58,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar12 = vfnmadd231ss_fma(auVar8,auVar11,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar10 = vfnmadd231ss_fma(auVar10,auVar11,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar18 = vfnmadd231ss_fma(auVar18,auVar11,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar9 = auVar12._0_4_;
  fVar25 = auVar10._0_4_;
  fVar27 = auVar18._0_4_;
  auVar8 = ZEXT416((uint)(fVar9 * fVar9 + fVar25 * fVar25 + fVar27 * fVar27));
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar28 = auVar8._0_4_;
  auVar13._0_4_ = fVar9 / fVar28;
  auVar13._4_12_ = auVar12._4_12_;
  auVar21._0_4_ = fVar25 / fVar28;
  auVar21._4_12_ = auVar10._4_12_;
  auVar8 = vinsertps_avx(auVar13,auVar21,0x10);
  wl.super_Tuple3<pbrt::Vector3,_float>.z = fVar27 / fVar28;
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar8._0_8_;
  auVar24 = ZEXT856(auVar18._8_8_);
  auVar16 = ZEXT856(auVar8._8_8_);
  SVar29 = I(this,wl,&lambda);
  auVar23._0_8_ = SVar29.values.values._8_8_;
  auVar23._8_56_ = auVar24;
  auVar15._0_8_ = SVar29.values.values._0_8_;
  auVar15._8_56_ = auVar16;
  auVar8 = vmovlhps_avx(auVar15._0_16_,auVar23._0_16_);
  auVar22._4_4_ = local_28._0_4_;
  auVar22._0_4_ = local_28._0_4_;
  auVar22._8_4_ = local_28._0_4_;
  auVar22._12_4_ = local_28._0_4_;
  auVar8 = vdivps_avx(auVar8,auVar22);
  if ((auVar8._0_4_ == 0.0) && (!NAN(auVar8._0_4_))) {
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 == 2) goto LAB_003e85ba;
      lVar1 = uVar7 * 4;
      uVar7 = uVar7 + 1;
    } while ((*(float *)(local_58 + lVar1 + -8) == 0.0) && (!NAN(*(float *)(local_58 + lVar1 + -8)))
            );
    if (2 < uVar7) {
LAB_003e85ba:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
      *(undefined8 *)&__return_storage_ptr__->set = 0;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      return __return_storage_ptr__;
    }
  }
  local_68 = auVar8._0_8_;
  uStack_60 = auVar8._8_8_;
  auVar14._4_4_ = local_38;
  auVar14._0_4_ = local_38;
  auVar14._8_4_ = local_38;
  auVar14._12_4_ = local_38;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20;
  (__return_storage_ptr__->optionalValue).__align = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_60;
  __return_storage_ptr__->set = true;
  uVar2 = vmovlps_avx(local_58);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  auVar5._4_4_ = fStack_44;
  auVar5._0_4_ = local_48;
  auVar5._8_4_ = fStack_40;
  auVar5._12_4_ = fStack_3c;
  auVar8 = vpermilps_avx(auVar5,0x50);
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar4 / fVar17;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar8;
  uVar2 = vmovlps_avx(auVar14);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Point3f p = renderFromLight(Point3f(0, 0, 0));
        Vector3f wi = Normalize(p - ctx.p());
        // Compute incident radiance _Li_ for _SpotLight_
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(-wi));
        SampledSpectrum Li = I(wl, lambda) / DistanceSquared(p, ctx.p());

        if (!Li)
            return {};
        return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
    }